

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O2

ptr<resp_appendix> __thiscall nuraft::resp_appendix::deserialize(resp_appendix *this,buffer *buf)

{
  uint8_t uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ptr<resp_appendix> pVar3;
  buffer_serializer bs;
  buffer_serializer bStack_28;
  
  buffer_serializer::buffer_serializer(&bStack_28,buf,LITTLE);
  std::make_shared<nuraft::resp_appendix>();
  uVar1 = buffer_serializer::get_u8(&bStack_28);
  _Var2._M_pi = extraout_RDX;
  if (uVar1 == '\0') {
    uVar1 = buffer_serializer::get_u8(&bStack_28);
    **(uint8_t **)this = uVar1;
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  pVar3.super___shared_ptr<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<resp_appendix>)
         pVar3.super___shared_ptr<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ptr<resp_appendix> deserialize(buffer& buf) {
        buffer_serializer bs(buf);
        ptr<resp_appendix> res = cs_new<resp_appendix>();

        uint8_t cur_ver = bs.get_u8();
        if (cur_ver != 0) {
            // Not supported version.
            return res;
        }

        res->extra_order_ = static_cast<extra_order>(bs.get_u8());
        return res;
    }